

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseOffsetExpr(WastParser *this,ExprList *out_expr_list)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6a;
  allocator local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  iterator local_48;
  size_type local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  ExprList *local_20;
  ExprList *out_expr_list_local;
  WastParser *this_local;
  
  local_20 = out_expr_list;
  out_expr_list_local = (ExprList *)this;
  bVar1 = ParseOffsetExprOpt(this,out_expr_list);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_68,"an offset expr",&local_69);
    local_48 = &local_68;
    local_40 = 1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_6a);
    __l._M_len = local_40;
    __l._M_array = local_48;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_38,__l,&local_6a);
    this_local._4_4_ = ErrorExpected(this,&local_38,"(i32.const 123)");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_38);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_6a);
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48;
    do {
      local_80 = local_80 + -1;
      std::__cxx11::string::~string((string *)local_80);
    } while (local_80 != &local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseOffsetExpr(ExprList* out_expr_list) {
  WABT_TRACE(ParseOffsetExpr);
  if (!ParseOffsetExprOpt(out_expr_list)) {
    return ErrorExpected({"an offset expr"}, "(i32.const 123)");
  }
  return Result::Ok;
}